

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MMapFileReaderTests.cpp
# Opt level: O0

int testMMapFileReaderTestsReadStruct(void)

{
  Span<unsigned_short,_3UL> data_00;
  bool bVar1;
  string *psVar2;
  uint64_t uVar3;
  ostream *poVar4;
  array<unsigned_short,_3UL> *v;
  Util *in_RSI;
  pointer in_stack_fffffffffffffdd8;
  undefined8 in_stack_fffffffffffffde0;
  Int16Data *data;
  range_error *anon_var_0_1;
  bool caughtCorrectException_1;
  range_error *anon_var_0;
  undefined1 local_a0 [3];
  bool caughtCorrectException;
  MMapFileReader reader;
  undefined1 local_40 [8];
  array<unsigned_short,_3UL> values;
  AutoDeleteTempFile tempfile;
  
  MILBlob::TestUtil::AutoDeleteTempFile::AutoDeleteTempFile((AutoDeleteTempFile *)&values);
  local_40._4_2_ = 0x1e;
  local_40._0_4_ = 0x14000a;
  psVar2 = MILBlob::TestUtil::AutoDeleteTempFile::GetFilename_abi_cxx11_
                     ((AutoDeleteTempFile *)&values);
  reader._56_8_ =
       MILBlob::Util::MakeSpan<unsigned_short,3ul>((Span<unsigned_short,_3UL> *)local_40,in_RSI,v);
  data_00._8_8_ = in_stack_fffffffffffffde0;
  data_00.m_ptr = in_stack_fffffffffffffdd8;
  MILBlob::TestUtil::WriteBlobFile<unsigned_short,3ul>(psVar2,data_00);
  psVar2 = MILBlob::TestUtil::AutoDeleteTempFile::GetFilename_abi_cxx11_
                     ((AutoDeleteTempFile *)&values);
  MILBlob::Blob::MMapFileReader::MMapFileReader((MMapFileReader *)local_a0,psVar2);
  uVar3 = MILBlob::Blob::MMapFileReader::GetLength((MMapFileReader *)local_a0);
  if (uVar3 == 6) {
    bVar1 = MILBlob::Blob::MMapFileReader::IsEncrypted((MMapFileReader *)local_a0);
    if (bVar1) {
      poVar4 = std::operator<<((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/MMapFileReaderTests.cpp"
                              );
      poVar4 = std::operator<<(poVar4,":");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x58);
      poVar4 = std::operator<<(poVar4,": error: ");
      poVar4 = std::operator<<(poVar4,"!(reader.IsEncrypted())");
      poVar4 = std::operator<<(poVar4," was false, expected true.");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    }
    else {
      MILBlob::Blob::MMapFileReader::ReadStruct<testMMapFileReaderTestsReadStruct()::Int16Data>
                ((MMapFileReader *)local_a0,6);
      poVar4 = std::operator<<((ostream *)&std::clog,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/MMapFileReaderTests.cpp"
                              );
      poVar4 = std::operator<<(poVar4,":");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x65);
      std::operator<<(poVar4,": expected exception, but none thrown.\n");
    }
  }
  else {
    poVar4 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/MMapFileReaderTests.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x57);
    poVar4 = std::operator<<(poVar4,": error: ");
    poVar4 = std::operator<<(poVar4,"(reader.GetLength()) == (uint64_t(6))");
    poVar4 = std::operator<<(poVar4," was false, expected true.");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  MILBlob::Blob::MMapFileReader::~MMapFileReader((MMapFileReader *)local_a0);
  MILBlob::TestUtil::AutoDeleteTempFile::~AutoDeleteTempFile((AutoDeleteTempFile *)&values);
  return 1;
}

Assistant:

int testMMapFileReaderTestsReadStruct()
{
    AutoDeleteTempFile tempfile;

    {
        std::array<uint16_t, 3> values{10, 20, 30};
        TestUtil::WriteBlobFile(tempfile.GetFilename(), Util::MakeSpan(values));
    }

    MMapFileReader reader(tempfile.GetFilename());
    ML_ASSERT_EQ(reader.GetLength(), uint64_t(6));
    ML_ASSERT_NOT(reader.IsEncrypted());

    struct Int16Data {
        uint16_t a;
        uint16_t b;
    };

    struct Int64Data {
        uint64_t a;
        uint64_t b;
    };

    // test invalid offsets/lenths
    ML_ASSERT_THROWS(reader.ReadStruct<Int16Data>(6), std::range_error);
    ML_ASSERT_THROWS(reader.ReadStruct<Int64Data>(0), std::range_error);

    {
        const Int16Data& data = reader.ReadStruct<Int16Data>(2);
        ML_ASSERT_EQ(data.a, 20);
        ML_ASSERT_EQ(data.b, 30);
    }

    return 0;
}